

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall CClient::DemoRecorder_Start(CClient *this,char *pFilename,bool WithTimestamp)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  char aDate [20];
  char aFilename [128];
  char local_c8 [32];
  char local_a8 [136];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_IClient).m_State == 3) {
    if (WithTimestamp) {
      str_timestamp(local_c8,0x14);
      str_format(local_a8,0x80,"demos/%s_%s.demo",pFilename,local_c8);
    }
    else {
      str_format(local_a8,0x80,"demos/%s.demo",pFilename);
    }
    iVar1 = (*(this->m_pGameClient->super_IInterface)._vptr_IInterface[0x13])();
    CDemoRecorder::Start
              (&this->m_DemoRecorder,local_a8,(char *)CONCAT44(extraout_var,iVar1),
               this->m_aCurrentMap,(SHA256_DIGEST)*&(this->m_CurrentMapSha256).data,
               this->m_CurrentMapCrc,"client");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"demorec/record","client is not online",0);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CClient::DemoRecorder_Start(const char *pFilename, bool WithTimestamp)
{
	if(State() != IClient::STATE_ONLINE)
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "demorec/record", "client is not online");
	else
	{
		char aFilename[128];
		if(WithTimestamp)
		{
			char aDate[20];
			str_timestamp(aDate, sizeof(aDate));
			str_format(aFilename, sizeof(aFilename), "demos/%s_%s.demo", pFilename, aDate);
		}
		else
			str_format(aFilename, sizeof(aFilename), "demos/%s.demo", pFilename);
		m_DemoRecorder.Start(aFilename, GameClient()->NetVersion(), m_aCurrentMap, m_CurrentMapSha256, m_CurrentMapCrc, "client");
	}
}